

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O0

void CB_EVAL::parse_label(parser *p,shared_data *sd,void *v,v_array<substring> *words)

{
  substring s;
  size_t sVar1;
  undefined8 uVar2;
  substring *psVar3;
  uint64_t uVar4;
  substring **ppsVar5;
  v_array<substring> *in_RCX;
  undefined4 *in_RDX;
  stringstream __msg;
  label *ld;
  v_array<substring> *in_stack_000003f8;
  void *in_stack_00000400;
  shared_data *in_stack_00000408;
  parser *in_stack_00000410;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  undefined1 uVar6;
  int in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  vw_exception *in_stack_fffffffffffffe30;
  stringstream local_1b0 [16];
  ostream local_1a0;
  undefined4 *local_28;
  v_array<substring> *local_20;
  
  local_28 = in_RDX;
  local_20 = in_RCX;
  sVar1 = v_array<substring>::size(in_RCX);
  if (sVar1 < 2) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(&local_1a0,"Evaluation can not happen without an action and an exploration");
    uVar6 = 1;
    uVar2 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
               (string *)CONCAT17(uVar6,in_stack_fffffffffffffe18));
    __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  psVar3 = v_array<substring>::operator[](local_20,0);
  s.end._0_7_ = in_stack_fffffffffffffe18;
  s.begin = psVar3->end;
  s.end._7_1_ = in_stack_fffffffffffffe1f;
  uVar4 = hashstring(s,(uint64_t)psVar3->begin);
  *local_28 = (int)uVar4;
  ppsVar5 = v_array<substring>::begin(local_20);
  *ppsVar5 = *ppsVar5 + 1;
  CB::parse_label(in_stack_00000410,in_stack_00000408,in_stack_00000400,in_stack_000003f8);
  ppsVar5 = v_array<substring>::begin(local_20);
  *ppsVar5 = *ppsVar5 + -1;
  return;
}

Assistant:

void parse_label(parser* p, shared_data* sd, void* v, v_array<substring>& words)
{
  CB_EVAL::label* ld = (CB_EVAL::label*)v;

  if (words.size() < 2)
    THROW("Evaluation can not happen without an action and an exploration");

  ld->action = (uint32_t)hashstring(words[0], 0);

  words.begin()++;

  CB::parse_label(p, sd, &(ld->event), words);

  words.begin()--;
}